

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::InternalUnpackTo
          (internal *this,string_view type_url,ValueType *value,Message *message)

{
  bool bVar1;
  string_view type_name;
  string_view type_url_00;
  GetTypeNameReturnType local_48;
  
  MessageLite::GetTypeName_abi_cxx11_(&local_48,(MessageLite *)value);
  type_name._M_str = local_48._M_dataplus._M_p;
  type_name._M_len = local_48._M_string_length;
  type_url_00._M_str = (char *)type_url._M_len;
  type_url_00._M_len = (size_t)this;
  bVar1 = InternalUnpackToLite
                    (type_name,type_url_00,(ValueType *)type_url._M_str,(MessageLite *)value);
  std::__cxx11::string::~string((string *)&local_48);
  return bVar1;
}

Assistant:

bool InternalUnpackTo(absl::string_view type_url, const ValueType& value,
                      Message* message) {
  return InternalUnpackToLite(message->GetTypeName(), type_url, value, message);
}